

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

LoadStatus __thiscall DepsLog::Load(DepsLog *this,string *path,State *state,string *err)

{
  int iVar1;
  uint uVar2;
  StringPiece path_00;
  Metrics *this_00;
  int64_t mtime_00;
  bool bVar3;
  int iVar4;
  int node_count;
  Metric *pMVar5;
  char *pcVar6;
  int *piVar7;
  size_t sVar8;
  Deps *this_01;
  size_type sVar9;
  reference ppNVar10;
  Metric *pMStack_80148;
  int kCompactionRatio;
  int kMinCompactionEntryCount;
  int id;
  int expected_id;
  uint checksum;
  Node *pNStack_800f8;
  Node *node;
  StringPiece subpath;
  int path_size;
  int i;
  Deps *deps;
  int deps_count;
  TimeStamp mtime;
  int out_id;
  int *deps_data;
  uint uStack_800a8;
  int iStack_800a4;
  bool is_deps;
  uint size;
  int total_dep_record_count;
  int unique_dep_record_count;
  bool read_failed;
  long offset;
  byte bStack_80085;
  int version;
  bool valid_header;
  FILE *pFStack_80080;
  FILE *f;
  char buf [524288];
  ScopedMetric metrics_h_scoped;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  State *state_local;
  string *path_local;
  DepsLog *this_local;
  
  local_30 = err;
  err_local = (string *)state;
  state_local = (State *)path;
  path_local = (string *)this;
  if ((Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMStack_80148 = (Metric *)0x0;
      Load::metrics_h_metric = pMStack_80148;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,".ninja_deps load",&local_51);
      pMVar5 = Metrics::NewMetric(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      Load::metrics_h_metric = pMVar5;
    }
    __cxa_guard_release(&Load(std::__cxx11::string_const&,State*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)(buf + 0x7fff8),Load::metrics_h_metric);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  pFStack_80080 = fopen(pcVar6,"rb");
  if (pFStack_80080 == (FILE *)0x0) {
    piVar7 = __errno_location();
    if (*piVar7 == 2) {
      this_local._4_4_ = LOAD_NOT_FOUND;
    }
    else {
      piVar7 = __errno_location();
      pcVar6 = strerror(*piVar7);
      std::__cxx11::string::operator=((string *)local_30,pcVar6);
      this_local._4_4_ = LOAD_ERROR;
    }
  }
  else {
    bStack_80085 = 1;
    offset._4_4_ = 0;
    pcVar6 = fgets((char *)&f,0x80000,pFStack_80080);
    if ((pcVar6 == (char *)0x0) ||
       (sVar8 = fread((void *)((long)&offset + 4),4,1,pFStack_80080), sVar8 == 0)) {
      bStack_80085 = 0;
    }
    if ((((bStack_80085 & 1) == 0) || (iVar4 = strcmp((char *)&f,"# ninjadeps\n"), iVar4 != 0)) ||
       (offset._4_4_ != 4)) {
      if (offset._4_4_ == 1) {
        std::__cxx11::string::operator=((string *)local_30,"deps log version change; rebuilding");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)local_30,"bad deps log signature or version; starting over");
      }
      fclose(pFStack_80080);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      unlink(pcVar6);
      this_local._4_4_ = LOAD_SUCCESS;
    }
    else {
      total_dep_record_count._3_1_ = 0;
      size = 0;
      iStack_800a4 = 0;
      while( true ) {
        _unique_dep_record_count = ftell(pFStack_80080);
        sVar8 = fread(&uStack_800a8,4,1,pFStack_80080);
        if (sVar8 == 0) break;
        bVar3 = (int)uStack_800a8 < 0;
        uStack_800a8 = uStack_800a8 & 0x7fffffff;
        if ((0x7ffff < uStack_800a8) ||
           (sVar8 = fread(&f,(ulong)uStack_800a8,1,pFStack_80080),
           mtime_00 = stack0xfffffffffff7ff8c, iVar4 = (int)f, sVar8 == 0)) {
          total_dep_record_count._3_1_ = 1;
          goto LAB_0012861c;
        }
        if (bVar3) {
          if ((uStack_800a8 & 3) != 0) {
            __assert_fail("size % 4 == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                          ,0xce,"LoadStatus DepsLog::Load(const string &, State *, string *)");
          }
          node_count = (uStack_800a8 >> 2) - 3;
          this_01 = (Deps *)operator_new(0x18);
          Deps::Deps(this_01,mtime_00,node_count);
          for (subpath.len_._4_4_ = 0; subpath.len_._4_4_ < node_count;
              subpath.len_._4_4_ = subpath.len_._4_4_ + 1) {
            iVar1 = *(int *)(buf + (long)subpath.len_._4_4_ * 4 + 4);
            sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&this->nodes_);
            if ((int)sVar9 <= iVar1) {
              __assert_fail("deps_data[i] < (int)nodes_.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                            ,0xd9,"LoadStatus DepsLog::Load(const string &, State *, string *)");
            }
            ppNVar10 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                 (&this->nodes_,
                                  (long)*(int *)(buf + (long)subpath.len_._4_4_ * 4 + 4));
            if (*ppNVar10 == (value_type)0x0) {
              __assert_fail("nodes_[deps_data[i]]",
                            "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                            ,0xda,"LoadStatus DepsLog::Load(const string &, State *, string *)");
            }
            ppNVar10 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                 (&this->nodes_,
                                  (long)*(int *)(buf + (long)subpath.len_._4_4_ * 4 + 4));
            this_01->nodes[subpath.len_._4_4_] = *ppNVar10;
          }
          iStack_800a4 = iStack_800a4 + 1;
          bVar3 = UpdateDeps(this,iVar4,this_01);
          if (!bVar3) {
            size = size + 1;
          }
        }
        else {
          subpath.len_._0_4_ = uStack_800a8 - 4;
          if ((int)subpath.len_ < 1) {
            __assert_fail("path_size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                          ,0xe3,"LoadStatus DepsLog::Load(const string &, State *, string *)");
          }
          if (buf[(long)(int)(uStack_800a8 - 5) + -8] == '\0') {
            subpath.len_._0_4_ = uStack_800a8 - 5;
          }
          if (buf[(long)((int)subpath.len_ + -1) + -8] == '\0') {
            subpath.len_._0_4_ = (int)subpath.len_ + -1;
          }
          if (buf[(long)((int)subpath.len_ + -1) + -8] == '\0') {
            subpath.len_._0_4_ = (int)subpath.len_ + -1;
          }
          StringPiece::StringPiece((StringPiece *)&node,(char *)&f,(long)(int)subpath.len_);
          path_00.len_ = (size_t)subpath.str_;
          path_00.str_ = (char *)node;
          pNStack_800f8 = State::GetNode((State *)err_local,path_00,0);
          uVar2 = *(uint *)(buf + ((ulong)uStack_800a8 - 0xc));
          sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&this->nodes_);
          if ((uint)sVar9 != (uVar2 ^ 0xffffffff)) {
            total_dep_record_count._3_1_ = 1;
            goto LAB_0012861c;
          }
          iVar4 = Node::id(pNStack_800f8);
          if (-1 < iVar4) {
            __assert_fail("node->id() < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log.cc"
                          ,0xfc,"LoadStatus DepsLog::Load(const string &, State *, string *)");
          }
          Node::set_id(pNStack_800f8,(uint)sVar9);
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->nodes_,&pNStack_800f8);
        }
      }
      iVar4 = feof(pFStack_80080);
      if (iVar4 == 0) {
        total_dep_record_count._3_1_ = 1;
      }
LAB_0012861c:
      if ((total_dep_record_count._3_1_ & 1) == 0) {
        fclose(pFStack_80080);
        if ((1000 < iStack_800a4) && ((int)(size * 3) < iStack_800a4)) {
          this->needs_recompaction_ = true;
        }
        this_local._4_4_ = LOAD_SUCCESS;
      }
      else {
        iVar4 = ferror(pFStack_80080);
        if (iVar4 == 0) {
          std::__cxx11::string::operator=((string *)local_30,"premature end of file");
        }
        else {
          iVar4 = ferror(pFStack_80080);
          pcVar6 = strerror(iVar4);
          std::__cxx11::string::operator=((string *)local_30,pcVar6);
        }
        fclose(pFStack_80080);
        bVar3 = Truncate((string *)state_local,_unique_dep_record_count,local_30);
        if (bVar3) {
          std::__cxx11::string::operator+=((string *)local_30,"; recovering");
          this_local._4_4_ = LOAD_SUCCESS;
        }
        else {
          this_local._4_4_ = LOAD_ERROR;
        }
      }
    }
  }
  version = 1;
  ScopedMetric::~ScopedMetric((ScopedMetric *)(buf + 0x7fff8));
  return this_local._4_4_;
}

Assistant:

LoadStatus DepsLog::Load(const string& path, State* state, string* err) {
  METRIC_RECORD(".ninja_deps load");
  char buf[kMaxRecordSize + 1];
  FILE* f = fopen(path.c_str(), "rb");
  if (!f) {
    if (errno == ENOENT)
      return LOAD_NOT_FOUND;
    *err = strerror(errno);
    return LOAD_ERROR;
  }

  bool valid_header = true;
  int version = 0;
  if (!fgets(buf, sizeof(buf), f) || fread(&version, 4, 1, f) < 1)
    valid_header = false;
  // Note: For version differences, this should migrate to the new format.
  // But the v1 format could sometimes (rarely) end up with invalid data, so
  // don't migrate v1 to v3 to force a rebuild. (v2 only existed for a few days,
  // and there was no release with it, so pretend that it never happened.)
  if (!valid_header || strcmp(buf, kFileSignature) != 0 ||
      version != kCurrentVersion) {
    if (version == 1)
      *err = "deps log version change; rebuilding";
    else
      *err = "bad deps log signature or version; starting over";
    fclose(f);
    unlink(path.c_str());
    // Don't report this as a failure.  An empty deps log will cause
    // us to rebuild the outputs anyway.
    return LOAD_SUCCESS;
  }

  long offset;
  bool read_failed = false;
  int unique_dep_record_count = 0;
  int total_dep_record_count = 0;
  for (;;) {
    offset = ftell(f);

    unsigned size;
    if (fread(&size, 4, 1, f) < 1) {
      if (!feof(f))
        read_failed = true;
      break;
    }
    bool is_deps = (size >> 31) != 0;
    size = size & 0x7FFFFFFF;

    if (size > kMaxRecordSize || fread(buf, size, 1, f) < 1) {
      read_failed = true;
      break;
    }

    if (is_deps) {
      assert(size % 4 == 0);
      int* deps_data = reinterpret_cast<int*>(buf);
      int out_id = deps_data[0];
      TimeStamp mtime;
      mtime = (TimeStamp)(((uint64_t)(unsigned int)deps_data[2] << 32) |
                          (uint64_t)(unsigned int)deps_data[1]);
      deps_data += 3;
      int deps_count = (size / 4) - 3;

      Deps* deps = new Deps(mtime, deps_count);
      for (int i = 0; i < deps_count; ++i) {
        assert(deps_data[i] < (int)nodes_.size());
        assert(nodes_[deps_data[i]]);
        deps->nodes[i] = nodes_[deps_data[i]];
      }

      total_dep_record_count++;
      if (!UpdateDeps(out_id, deps))
        ++unique_dep_record_count;
    } else {
      int path_size = size - 4;
      assert(path_size > 0);  // CanonicalizePath() rejects empty paths.
      // There can be up to 3 bytes of padding.
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      if (buf[path_size - 1] == '\0') --path_size;
      StringPiece subpath(buf, path_size);
      // It is not necessary to pass in a correct slash_bits here. It will
      // either be a Node that's in the manifest (in which case it will already
      // have a correct slash_bits that GetNode will look up), or it is an
      // implicit dependency from a .d which does not affect the build command
      // (and so need not have its slashes maintained).
      Node* node = state->GetNode(subpath, 0);

      // Check that the expected index matches the actual index. This can only
      // happen if two ninja processes write to the same deps log concurrently.
      // (This uses unary complement to make the checksum look less like a
      // dependency record entry.)
      unsigned checksum = *reinterpret_cast<unsigned*>(buf + size - 4);
      int expected_id = ~checksum;
      int id = nodes_.size();
      if (id != expected_id) {
        read_failed = true;
        break;
      }

      assert(node->id() < 0);
      node->set_id(id);
      nodes_.push_back(node);
    }
  }

  if (read_failed) {
    // An error occurred while loading; try to recover by truncating the
    // file to the last fully-read record.
    if (ferror(f)) {
      *err = strerror(ferror(f));
    } else {
      *err = "premature end of file";
    }
    fclose(f);

    if (!Truncate(path, offset, err))
      return LOAD_ERROR;

    // The truncate succeeded; we'll just report the load error as a
    // warning because the build can proceed.
    *err += "; recovering";
    return LOAD_SUCCESS;
  }

  fclose(f);

  // Rebuild the log if there are too many dead records.
  int kMinCompactionEntryCount = 1000;
  int kCompactionRatio = 3;
  if (total_dep_record_count > kMinCompactionEntryCount &&
      total_dep_record_count > unique_dep_record_count * kCompactionRatio) {
    needs_recompaction_ = true;
  }

  return LOAD_SUCCESS;
}